

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bracket_notation_parser_impl.h
# Opt level: O1

bool __thiscall
parser::BracketNotationParser<label::StringLabel>::validate_input
          (BracketNotationParser<label::StringLabel> *this,string *tree_string)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  
  uVar2 = 0;
  if (tree_string->_M_string_length != 0) {
    pcVar4 = (tree_string->_M_dataplus)._M_p;
    pcVar3 = pcVar4 + tree_string->_M_string_length;
    iVar5 = 0;
    do {
      cVar1 = *pcVar4;
      if (cVar1 == this->kEscapeChar) {
        pcVar4 = pcVar4 + 1;
      }
      else if (cVar1 == *(this->kLeftBracket)._M_dataplus._M_p) {
        iVar5 = iVar5 + 1;
        uVar2 = uVar2 + 1;
      }
      else {
        iVar5 = iVar5 - (uint)(cVar1 == *(this->kRightBracket)._M_dataplus._M_p);
      }
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 != pcVar3);
    uVar2 = (uint)(uVar2 != 0 && iVar5 == 0);
  }
  return SUB41(uVar2,0);
}

Assistant:

bool BracketNotationParser<Label>::validate_input(const std::string& tree_string) const {
  int bracket_diff_counter = 0; // Counts difference between the numbers of left and right brackets.
  int bracket_pair_counter = 0; // Counts number of bracket pairs - number of nodes assuming correct nesting.
  // Loop over all characters.
  for(auto it = tree_string.begin(); it != tree_string.end(); ++it) {
    if (*it == kEscapeChar) { // Skip next character if kEscapeChar is found.
      ++it;
    } else if (*it == kLeftBracket[0]) { // Increase bracket_counter when kLeftBracket found.
      bracket_diff_counter++;
      bracket_pair_counter++;
    } else if (*it == kRightBracket[0]) { // Decrease bracket_counter when kRightBracket found.
      bracket_diff_counter--;
    }
  }
  if (bracket_diff_counter != 0 || bracket_pair_counter == 0) {
    return false;
  }
  return true;
}